

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void do_pktrack(CHAR_DATA *ch,char *argument)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  MYSQL *pMVar5;
  undefined8 uVar6;
  char *in_RSI;
  char *pcVar7;
  string query;
  bool found;
  int i;
  char buf [4608];
  char qpart [4608];
  char arg1 [4608];
  BUFFER *buffer;
  MYSQL_RES *res_set;
  MYSQL_ROW row;
  MYSQL *conn;
  CHAR_DATA *in_stack_ffffffffffffc838;
  char *in_stack_ffffffffffffc840;
  CHAR_DATA *in_stack_ffffffffffffc848;
  char *in_stack_ffffffffffffc850;
  undefined4 in_stack_ffffffffffffc858;
  char *local_3730 [2];
  string local_3720 [35];
  byte local_36fd;
  uint local_36fc;
  char local_36f8 [408];
  format_args in_stack_ffffffffffffcaa0;
  string_view in_stack_ffffffffffffcab0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
  local_24f8 [288];
  char local_12f8 [4608];
  BUFFER *local_f8;
  long local_f0;
  undefined8 *local_e8;
  MYSQL *local_e0;
  char *local_d8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_c8 [3]
  ;
  undefined8 local_b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_a8;
  char *local_a0;
  size_t local_98;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_90;
  char *local_88;
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char **local_68;
  char *local_60;
  char **local_58;
  char **local_50;
  char *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_10;
  char *local_8;
  
  local_36fc = 0;
  local_36fd = 0;
  bVar2 = str_cmp(in_RSI,"");
  if (!bVar2) {
    send_to_char(in_stack_ffffffffffffc850,in_stack_ffffffffffffc848);
    return;
  }
  local_f8 = new_buf();
  local_d8 = one_argument(in_stack_ffffffffffffc840,(char *)in_stack_ffffffffffffc838);
  bVar2 = str_cmp(local_12f8,"wins");
  if (bVar2) {
    bVar2 = str_cmp(local_12f8,"losses");
    if (bVar2) {
      bVar2 = str_cmp(local_12f8,"all");
      if (bVar2) {
        bVar2 = str_cmp(local_12f8,"date");
        if (bVar2) {
          bVar2 = str_cmp(local_12f8,"location");
          if (bVar2) {
            send_to_char(in_stack_ffffffffffffc850,in_stack_ffffffffffffc848);
            return;
          }
          pcVar7 = "room RLIKE \'%s\'";
          sprintf((char *)local_24f8,"room RLIKE \'%s\'",local_d8);
        }
        else {
          pcVar7 = "date RLIKE \'%s\'";
          sprintf((char *)local_24f8,"date RLIKE \'%s\'",local_d8);
        }
      }
      else {
        pcVar7 = "killer RLIKE \'%s\' OR victim RLIKE \'%s\'";
        sprintf((char *)local_24f8,"killer RLIKE \'%s\' OR victim RLIKE \'%s\'",local_d8,local_d8);
      }
    }
    else {
      pcVar7 = "victim RLIKE \'%s\'";
      sprintf((char *)local_24f8,"victim RLIKE \'%s\'",local_d8);
    }
  }
  else {
    pcVar7 = "killer RLIKE \'%s\'";
    sprintf((char *)local_24f8,"killer RLIKE \'%s\'",local_d8);
  }
  local_68 = local_3730;
  local_70 = "SELECT * FROM pklogs WHERE {}";
  local_60 = "SELECT * FROM pklogs WHERE {}";
  local_3730[0] = "SELECT * FROM pklogs WHERE {}";
  local_58 = local_68;
  local_98 = std::char_traits<char>::length((char_type *)0x65bd33);
  local_8 = local_70;
  local_78 = local_3720;
  local_88 = local_3730[0];
  local_90 = local_24f8;
  local_50 = &local_88;
  local_a0 = local_3730[0];
  sStack_80 = local_98;
  local_48 = local_a0;
  sStack_40 = local_98;
  local_c8[0] = fmt::v9::
                make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                          (local_90,(v9 *)pcVar7,(char (*) [4608])local_78);
  local_30 = &local_b0;
  local_38 = local_c8;
  local_20 = 0xc;
  local_b0 = 0xc;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  local_a8 = local_38;
  fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffcab0,in_stack_ffffffffffffcaa0);
  pMVar5 = open_conn();
  local_e0 = pMVar5;
  uVar6 = std::__cxx11::string::c_str();
  mysql_query(pMVar5,uVar6);
  local_f0 = mysql_store_result(local_e0);
  if ((local_f0 == 0) && (iVar3 = mysql_field_count(local_e0), iVar3 != 0)) {
    send_to_char(in_stack_ffffffffffffc850,in_stack_ffffffffffffc848);
  }
  else if (local_f0 != 0) {
    while (local_e8 = (undefined8 *)mysql_fetch_row(local_f0), local_e8 != (undefined8 *)0x0) {
      uVar4 = local_36fc + 1;
      uVar6 = *local_e8;
      local_36fc = uVar4;
      iVar3 = atoi((char *)local_e8[1]);
      pcVar7 = cabal_table[iVar3].name;
      uVar1 = local_e8[2];
      iVar3 = atoi((char *)local_e8[3]);
      in_stack_ffffffffffffc838 = (CHAR_DATA *)cabal_table[iVar3].name;
      in_stack_ffffffffffffc848 = (CHAR_DATA *)local_e8[4];
      in_stack_ffffffffffffc840 = (char *)local_e8[5];
      sprintf(local_36f8,"%3d) %s(%s) killed %s(%s) at %s on %s\n\r",(ulong)uVar4,uVar6,pcVar7,uVar1
             );
      add_buf((BUFFER *)CONCAT44(uVar4,in_stack_ffffffffffffc858),in_stack_ffffffffffffc850);
      local_36fd = 1;
    }
    if ((local_36fd & 1) == 0) {
      send_to_char(in_stack_ffffffffffffc850,in_stack_ffffffffffffc848);
      goto LAB_0065c118;
    }
    mysql_free_result(local_f0);
    buf_string(local_f8);
    page_to_char(in_stack_ffffffffffffc840,in_stack_ffffffffffffc838);
    free_buf((BUFFER *)0x65c0f8);
  }
  mysql_close(local_e0);
LAB_0065c118:
  std::__cxx11::string::~string(local_3720);
  return;
}

Assistant:

void do_pktrack(CHAR_DATA *ch, char *argument)
{
	MYSQL *conn;
	MYSQL_ROW row;
	MYSQL_RES *res_set;
	BUFFER *buffer;
	char arg1[MSL], qpart[MSL], buf[MSL];
	int i = 0;
	bool found= false;

	if (!str_cmp(argument, ""))
	{
		send_to_char("Syntax: pktrack <wins/losses/all/date/location> <value>\n\r", ch);
		return;
	}

	buffer = new_buf();
	argument = one_argument(argument, arg1);

	if (!str_cmp(arg1, "wins"))
	{
		sprintf(qpart, "killer RLIKE '%s'", argument);
	}
	else if (!str_cmp(arg1, "losses"))
	{
		sprintf(qpart, "victim RLIKE '%s'", argument);
	}
	else if (!str_cmp(arg1, "all"))
	{
		sprintf(qpart, "killer RLIKE '%s' OR victim RLIKE '%s'", argument, argument);
	}
	else if (!str_cmp(arg1, "date"))
	{
		sprintf(qpart, "date RLIKE '%s'", argument);
	}
	else if (!str_cmp(arg1, "location"))
	{
		sprintf(qpart, "room RLIKE '%s'", argument);
	}
	else
	{
		send_to_char("Invalid option.\n\r", ch);
		return;
	}

	auto query = fmt::format("SELECT * FROM pklogs WHERE {}", qpart);
	conn = open_conn();
	mysql_query(conn, query.c_str());
	res_set = mysql_store_result(conn);

	if (res_set == nullptr && mysql_field_count(conn) > 0)
	{
		send_to_char("Error accessing results.\n\r", ch);
	}
	else if (res_set)
	{
		while ((row = mysql_fetch_row(res_set)) != nullptr)
		{
			sprintf(buf, "%3d) %s(%s) killed %s(%s) at %s on %s\n\r",
				++i,
				row[0],
				cabal_table[atoi(row[1])].name,
				row[2],
				cabal_table[atoi(row[3])].name, row[5],
				row[4]);

			add_buf(buffer, buf);
			found = true;
		}

		if (!found)
		{
			send_to_char("No matching results found.\n\r", ch);
			return;
		}

		mysql_free_result(res_set);
		page_to_char(buf_string(buffer), ch);
		free_buf(buffer);
	}

	mysql_close(conn);
}